

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O0

longlong valence(char c)

{
  longlong lStack_10;
  char c_local;
  
  if (c == '.') {
    lStack_10 = -1;
  }
  else if (c == 'H') {
    lStack_10 = 1;
  }
  else if (c == 'O') {
    lStack_10 = 2;
  }
  else if (c == 'N') {
    lStack_10 = 3;
  }
  else {
    lStack_10 = 4;
  }
  return lStack_10;
}

Assistant:

long long valence(char c){
    if(c == '.') {
        return -1;
    }
    if(c == 'H') {
        return 1;
    }
    if(c == 'O') {
        return 2;
    }
    if(c == 'N') {
        return 3;
    }
    return 4;
}